

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void last_wal_flush_header_test(void)

{
  fdb_encryption_key new_key;
  void *ptr;
  fdb_doc *doc;
  long lVar1;
  fdb_kvs_handle **ppfVar2;
  fdb_status fVar3;
  int iVar4;
  fdb_kvs_handle **ppfVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  fdb_kvs_handle *pfVar9;
  uint uVar10;
  long lVar11;
  fdb_doc **ppfVar12;
  fdb_doc *pfVar13;
  char *ptr_handle;
  fdb_config *pfVar14;
  fdb_doc *__s;
  char *pcVar15;
  ulong uVar16;
  fdb_file_handle **ptr_fhandle;
  fdb_doc **doc_00;
  fdb_kvs_handle **ppfVar17;
  char *handle;
  bool bVar18;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile_txn1;
  fdb_kvs_handle *db_txn1;
  fdb_file_handle *dbfile;
  fdb_file_handle *dbfile_txn2;
  fdb_kvs_handle *db_txn2;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_config fconfig;
  char keybuf [256];
  char bodybuf [256];
  char metabuf [256];
  fdb_kvs_handle *pfStack_1b4f0;
  fdb_file_handle *pfStack_1b4e8;
  void *pvStack_1b4e0;
  size_t asStack_1b4d8 [3];
  undefined4 uStack_1b4c0;
  undefined4 uStack_1b4bc;
  undefined4 uStack_1b4b8;
  undefined4 uStack_1b4b4;
  undefined4 uStack_1b4b0;
  fdb_kvs_config fStack_1b4a8;
  timeval tStack_1b490;
  fdb_config fStack_1b480;
  char acStack_1b388 [256];
  char acStack_1b288 [256];
  char acStack_1b188 [264];
  fdb_config *pfStack_1b080;
  fdb_kvs_handle **ppfStack_1b078;
  fdb_kvs_handle *pfStack_1b070;
  fdb_kvs_handle **ppfStack_1b068;
  fdb_kvs_handle *pfStack_1b060;
  code *pcStack_1b058;
  fdb_kvs_handle *pfStack_1b040;
  fdb_file_handle *pfStack_1b038;
  fdb_kvs_handle *pfStack_1b030;
  fdb_kvs_handle *pfStack_1b028;
  fdb_kvs_config fStack_1b020;
  timeval tStack_1b008;
  fdb_config fStack_1aff8;
  fdb_kvs_handle *apfStack_1af00 [32];
  fdb_config fStack_1ae00;
  fdb_kvs_handle **ppfStack_1acf8;
  fdb_kvs_handle **ppfStack_1acf0;
  fdb_kvs_handle **ppfStack_1ace8;
  fdb_kvs_handle *pfStack_1ace0;
  fdb_kvs_handle *pfStack_1acd0;
  fdb_kvs_handle *pfStack_1acc8;
  fdb_kvs_handle **ppfStack_1acc0;
  fdb_kvs_handle *pfStack_1acb8;
  fdb_kvs_config fStack_1acb0;
  undefined1 auStack_1ac98 [128];
  fdb_kvs_handle *apfStack_1ac18 [33];
  fdb_config fStack_1ab10;
  fdb_kvs_handle *apfStack_1aa18 [32];
  fdb_kvs_handle *apfStack_1a918 [32];
  fdb_kvs_handle fStack_1a818;
  undefined8 auStack_1a418 [896];
  fdb_kvs_handle *apfStack_18818 [1025];
  fdb_doc **ppfStack_16810;
  char *pcStack_16808;
  long lStack_16800;
  fdb_doc *pfStack_167f8;
  fdb_doc **ppfStack_167f0;
  fdb_doc *pfStack_167e8;
  fdb_doc *pfStack_167d0;
  fdb_file_handle *pfStack_167c8;
  long lStack_167c0;
  fdb_kvs_handle *pfStack_167b8;
  long lStack_167b0;
  long lStack_167a8;
  fdb_doc **ppfStack_167a0;
  long lStack_16798;
  fdb_doc **ppfStack_16790;
  size_t sStack_16788;
  timeval tStack_16780;
  fdb_kvs_config fStack_16770;
  fdb_file_info fStack_16758;
  fdb_doc afStack_16710 [3];
  char acStack_16610 [264];
  fdb_config fStack_16508;
  char acStack_16410 [256];
  fdb_doc *apfStack_16310 [2999];
  size_t sStack_10558;
  size_t asStack_10550 [1023];
  undefined1 auStack_e551 [57225];
  fdb_doc **ppfStack_5c8;
  fdb_config *pfStack_5c0;
  fdb_file_handle **ppfStack_5b8;
  ulong uStack_5b0;
  fdb_kvs_handle **ppfStack_5a8;
  fdb_kvs_handle **ppfStack_5a0;
  fdb_doc *local_588;
  fdb_kvs_handle *local_580;
  undefined1 local_578 [24];
  fdb_file_handle *local_560;
  fdb_kvs_handle *local_558;
  fdb_kvs_config local_550;
  fdb_doc *local_538 [31];
  timeval local_440;
  fdb_config local_430;
  char local_338 [256];
  fdb_file_handle *local_238 [32];
  char local_138 [264];
  
  ppfStack_5a0 = (fdb_kvs_handle **)0x118363;
  gettimeofday(&local_440,(__timezone_ptr_t)0x0);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118368;
  memleak_start();
  local_588 = (fdb_doc *)0x0;
  ppfStack_5a0 = (fdb_kvs_handle **)0x118379;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_5a0 = (fdb_kvs_handle **)0x118389;
  fdb_get_default_config();
  ppfStack_5a0 = (fdb_kvs_handle **)0x118396;
  fdb_get_default_kvs_config();
  local_430.buffercache_size = 0;
  local_430.flags = 1;
  local_430.purging_interval = 0;
  local_430.compaction_threshold = '\0';
  ppfStack_5a0 = (fdb_kvs_handle **)0x1183c9;
  fdb_open((fdb_file_handle **)(local_578 + 0x10),"dummy1",&local_430);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1183dc;
  fdb_open((fdb_file_handle **)local_578,"dummy1",&local_430);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1183ed;
  fdb_kvs_open_default((fdb_file_handle *)local_578._16_8_,&local_580,&local_550);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1183fe;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_578._0_8_,(fdb_kvs_handle **)(local_578 + 8),&local_550);
  ppfVar12 = local_538;
  uVar16 = 0;
  do {
    ppfStack_5a0 = (fdb_kvs_handle **)0x118422;
    sprintf(local_338,"key%d",uVar16 & 0xffffffff);
    ppfStack_5a0 = (fdb_kvs_handle **)0x11843e;
    sprintf(local_138,"meta%d",uVar16 & 0xffffffff);
    ptr_fhandle = local_238;
    ppfStack_5a0 = (fdb_kvs_handle **)0x11845a;
    sprintf((char *)ptr_fhandle,"body%d",uVar16 & 0xffffffff);
    ppfStack_5a0 = (fdb_kvs_handle **)0x118462;
    ppfVar5 = (fdb_kvs_handle **)strlen(local_338);
    ppfStack_5a0 = (fdb_kvs_handle **)0x11846d;
    sVar6 = strlen(local_138);
    ppfStack_5a0 = (fdb_kvs_handle **)0x118478;
    sVar7 = strlen((char *)ptr_fhandle);
    ppfStack_5a0 = (fdb_kvs_handle **)0x118498;
    fdb_doc_create(ppfVar12,local_338,(size_t)ppfVar5,local_138,sVar6,ptr_fhandle,sVar7);
    uVar16 = uVar16 + 1;
    ppfVar12 = ppfVar12 + 1;
  } while (uVar16 != 0x1e);
  lVar11 = 0;
  do {
    ppfStack_5a0 = (fdb_kvs_handle **)0x1184ba;
    fdb_set(local_580,local_538[lVar11]);
    lVar11 = lVar11 + 1;
  } while (lVar11 == 1);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1184d2;
  fdb_begin_transaction((fdb_file_handle *)local_578._0_8_,'\x02');
  lVar11 = 0;
  do {
    ppfStack_5a0 = (fdb_kvs_handle **)0x1184e3;
    fdb_set((fdb_kvs_handle *)local_578._8_8_,local_538[lVar11 + 2]);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1184fe;
  fdb_commit((fdb_file_handle *)local_578._16_8_,'\x01');
  ppfStack_5a0 = (fdb_kvs_handle **)0x118506;
  fdb_close((fdb_file_handle *)local_578._16_8_);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118513;
  fdb_close((fdb_file_handle *)local_578._0_8_);
  ppfVar17 = (fdb_kvs_handle **)0x1551a5;
  pfVar14 = &local_430;
  ppfStack_5a0 = (fdb_kvs_handle **)0x118530;
  fdb_open((fdb_file_handle **)(local_578 + 0x10),"dummy1",pfVar14);
  ppfStack_5a0 = (fdb_kvs_handle **)0x11853e;
  fdb_open((fdb_file_handle **)local_578,"dummy1",pfVar14);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118553;
  fdb_kvs_open_default((fdb_file_handle *)local_578._16_8_,&local_580,&local_550);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118563;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_578._0_8_,(fdb_kvs_handle **)(local_578 + 8),&local_550);
  uVar16 = 0;
  do {
    ppfStack_5a0 = (fdb_kvs_handle **)0x11858f;
    fdb_doc_create(&local_588,local_538[uVar16]->key,local_538[uVar16]->keylen,(void *)0x0,0,
                   (void *)0x0,0);
    ppfStack_5a0 = (fdb_kvs_handle **)0x11859e;
    fVar3 = fdb_get(local_580,local_588);
    if (uVar16 < 2) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118b46;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118b4b;
    ppfStack_5a0 = (fdb_kvs_handle **)0x1185bf;
    fdb_doc_free(local_588);
    local_588 = (fdb_doc *)0x0;
    uVar16 = uVar16 + 1;
  } while (uVar16 != 4);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1185e0;
  fdb_begin_transaction((fdb_file_handle *)local_578._0_8_,'\x02');
  lVar11 = 0;
  do {
    ppfStack_5a0 = (fdb_kvs_handle **)0x1185f1;
    fdb_set((fdb_kvs_handle *)local_578._8_8_,local_538[lVar11 + 2]);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  lVar11 = 0;
  do {
    ppfStack_5a0 = (fdb_kvs_handle **)0x11860e;
    fdb_set(local_580,local_538[lVar11 + 4]);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118629;
  fdb_end_transaction((fdb_file_handle *)local_578._0_8_,'\x01');
  ppfStack_5a0 = (fdb_kvs_handle **)0x118636;
  fdb_close((fdb_file_handle *)local_578._16_8_);
  ppfStack_5a0 = (fdb_kvs_handle **)0x11863e;
  fdb_close((fdb_file_handle *)local_578._0_8_);
  ppfVar17 = (fdb_kvs_handle **)0x1551a5;
  pfVar14 = &local_430;
  ppfStack_5a0 = (fdb_kvs_handle **)0x11865b;
  fdb_open((fdb_file_handle **)(local_578 + 0x10),"dummy1",pfVar14);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118669;
  fdb_open((fdb_file_handle **)local_578,"dummy1",pfVar14);
  ppfStack_5a0 = (fdb_kvs_handle **)0x11867e;
  fdb_kvs_open_default((fdb_file_handle *)local_578._16_8_,&local_580,&local_550);
  ppfStack_5a0 = (fdb_kvs_handle **)0x11868e;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_578._0_8_,(fdb_kvs_handle **)(local_578 + 8),&local_550);
  uVar16 = 0;
  do {
    ppfStack_5a0 = (fdb_kvs_handle **)0x1186ba;
    fdb_doc_create(&local_588,local_538[uVar16]->key,local_538[uVar16]->keylen,(void *)0x0,0,
                   (void *)0x0,0);
    ppfStack_5a0 = (fdb_kvs_handle **)0x1186c9;
    fVar3 = fdb_get(local_580,local_588);
    if ((uVar16 < 4) && (fVar3 != FDB_RESULT_SUCCESS)) {
      ppfStack_5a0 = (fdb_kvs_handle **)0x118b41;
      last_wal_flush_header_test();
      goto LAB_00118b41;
    }
    ppfStack_5a0 = (fdb_kvs_handle **)0x1186e1;
    fdb_doc_free(local_588);
    local_588 = (fdb_doc *)0x0;
    uVar16 = uVar16 + 1;
  } while (uVar16 != 6);
  lVar11 = 0;
  do {
    ppfStack_5a0 = (fdb_kvs_handle **)0x118707;
    fdb_set(local_580,local_538[lVar11 + 4]);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  ppfStack_5a0 = (fdb_kvs_handle **)0x11871f;
  fdb_begin_transaction((fdb_file_handle *)local_578._0_8_,'\x02');
  lVar11 = 0;
  do {
    ppfStack_5a0 = (fdb_kvs_handle **)0x118733;
    fdb_set((fdb_kvs_handle *)local_578._8_8_,local_538[lVar11 + 6]);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  ppfStack_5a0 = (fdb_kvs_handle **)0x11874b;
  fdb_commit((fdb_file_handle *)local_578._16_8_,'\x01');
  ppfStack_5a0 = (fdb_kvs_handle **)0x118767;
  fdb_open(&local_560,"dummy1",&local_430);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118779;
  fdb_kvs_open_default(local_560,&local_558,&local_550);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118786;
  fdb_begin_transaction(local_560,'\x02');
  lVar11 = 0;
  do {
    ppfStack_5a0 = (fdb_kvs_handle **)0x11879a;
    fdb_set(local_558,local_538[lVar11 + 8]);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1187b2;
  fdb_end_transaction(local_560,'\x01');
  ppfStack_5a0 = (fdb_kvs_handle **)0x1187bf;
  fdb_close((fdb_file_handle *)local_578._16_8_);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1187c9;
  fdb_close((fdb_file_handle *)local_578._0_8_);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1187d3;
  fdb_close(local_560);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1187ea;
  fdb_open((fdb_file_handle **)(local_578 + 0x10),"dummy1",&local_430);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1187fc;
  fdb_kvs_open_default((fdb_file_handle *)local_578._16_8_,&local_580,&local_550);
  uVar16 = 0;
  do {
    ppfStack_5a0 = (fdb_kvs_handle **)0x118828;
    fdb_doc_create(&local_588,local_538[uVar16]->key,local_538[uVar16]->keylen,(void *)0x0,0,
                   (void *)0x0,0);
    ppfStack_5a0 = (fdb_kvs_handle **)0x118837;
    fVar3 = fdb_get(local_580,local_588);
    if ((int)uVar16 - 8U < 0xfffffffe) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118b50;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118b55;
    ppfStack_5a0 = (fdb_kvs_handle **)0x11885b;
    fdb_doc_free(local_588);
    local_588 = (fdb_doc *)0x0;
    uVar16 = uVar16 + 1;
  } while (uVar16 != 10);
  pfVar14 = (fdb_config *)local_578;
  ppfStack_5a0 = (fdb_kvs_handle **)0x11888f;
  fdb_open((fdb_file_handle **)pfVar14,"dummy1",&local_430);
  ptr_fhandle = &local_560;
  ppfStack_5a0 = (fdb_kvs_handle **)0x1188a2;
  fdb_open(ptr_fhandle,"dummy1",&local_430);
  ppfVar17 = (fdb_kvs_handle **)(local_578 + 8);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1188bb;
  fdb_kvs_open_default((fdb_file_handle *)local_578._0_8_,ppfVar17,&local_550);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1188cf;
  fdb_kvs_open_default(local_560,&local_558,&local_550);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1188dd;
  fdb_begin_transaction((fdb_file_handle *)local_578._0_8_,'\x02');
  ppfVar5 = &local_580;
  ppfStack_5a0 = (fdb_kvs_handle **)0x1188f3;
  fdb_set(local_580,local_538[10]);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118905;
  fdb_commit((fdb_file_handle *)local_578._16_8_,'\x01');
  ppfStack_5a0 = (fdb_kvs_handle **)0x118916;
  fdb_set(local_580,local_538[0xb]);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118926;
  fdb_set((fdb_kvs_handle *)local_578._8_8_,local_538[0xc]);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118933;
  fdb_commit((fdb_file_handle *)local_578._16_8_,'\x01');
  ppfStack_5a0 = (fdb_kvs_handle **)0x118943;
  fdb_set((fdb_kvs_handle *)local_578._8_8_,local_538[0xd]);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118951;
  fdb_begin_transaction(local_560,'\x02');
  ppfStack_5a0 = (fdb_kvs_handle **)0x118961;
  fdb_set(local_558,local_538[0xe]);
  ppfStack_5a0 = (fdb_kvs_handle **)0x11896f;
  fdb_end_transaction((fdb_file_handle *)local_578._0_8_,'\x01');
  ppfStack_5a0 = (fdb_kvs_handle **)0x11897f;
  fdb_set(local_558,local_538[0xf]);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118990;
  fdb_set(local_580,local_538[0x10]);
  ppfStack_5a0 = (fdb_kvs_handle **)0x11899e;
  fdb_end_transaction(local_560,'\x01');
  ppfStack_5a0 = (fdb_kvs_handle **)0x1189af;
  fdb_set(local_580,local_538[0x11]);
  uVar16 = 0;
  ppfStack_5a0 = (fdb_kvs_handle **)0x1189bc;
  fdb_commit((fdb_file_handle *)local_578._16_8_,'\0');
  ppfStack_5a0 = (fdb_kvs_handle **)0x1189c4;
  fdb_close((fdb_file_handle *)local_578._16_8_);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1189cd;
  fdb_close((fdb_file_handle *)local_578._0_8_);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1189d6;
  fdb_close(local_560);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1189ed;
  fdb_open((fdb_file_handle **)(local_578 + 0x10),"dummy1",&local_430);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1189fd;
  fdb_kvs_open_default((fdb_file_handle *)local_578._16_8_,ppfVar5,&local_550);
  while( true ) {
    ppfStack_5a0 = (fdb_kvs_handle **)0x118a29;
    fdb_doc_create(&local_588,local_538[uVar16 + 10]->key,local_538[uVar16 + 10]->keylen,(void *)0x0
                   ,0,(void *)0x0,0);
    ppfStack_5a0 = (fdb_kvs_handle **)0x118a38;
    fVar3 = fdb_get(local_580,local_588);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ppfStack_5a0 = (fdb_kvs_handle **)0x118a4a;
    fdb_doc_free(local_588);
    local_588 = (fdb_doc *)0x0;
    uVar16 = uVar16 + 1;
    if (uVar16 == 8) {
      ppfStack_5a0 = (fdb_kvs_handle **)0x118a78;
      fdb_open((fdb_file_handle **)local_578,"dummy1",&local_430);
      ppfStack_5a0 = (fdb_kvs_handle **)0x118a8d;
      fdb_kvs_open_default
                ((fdb_file_handle *)local_578._0_8_,(fdb_kvs_handle **)(local_578 + 8),&local_550);
      ppfStack_5a0 = (fdb_kvs_handle **)0x118a9a;
      fdb_begin_transaction((fdb_file_handle *)local_578._0_8_,'\x02');
      ppfStack_5a0 = (fdb_kvs_handle **)0x118aaa;
      fdb_set((fdb_kvs_handle *)local_578._8_8_,local_538[0x14]);
      ppfStack_5a0 = (fdb_kvs_handle **)0x118abb;
      fdb_compact((fdb_file_handle *)local_578._16_8_,"dummy2");
      ppfStack_5a0 = (fdb_kvs_handle **)0x118ac8;
      fdb_end_transaction((fdb_file_handle *)local_578._0_8_,'\x01');
      ppfStack_5a0 = (fdb_kvs_handle **)0x118ad2;
      fdb_close((fdb_file_handle *)local_578._16_8_);
      ppfStack_5a0 = (fdb_kvs_handle **)0x118ada;
      fdb_close((fdb_file_handle *)local_578._0_8_);
      lVar11 = 0;
      do {
        ppfStack_5a0 = (fdb_kvs_handle **)0x118ae6;
        fdb_doc_free(local_538[lVar11]);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x1e);
      ppfStack_5a0 = (fdb_kvs_handle **)0x118af4;
      fdb_shutdown();
      ppfStack_5a0 = (fdb_kvs_handle **)0x118af9;
      memleak_end();
      pcVar15 = "%s PASSED\n";
      if (last_wal_flush_header_test()::__test_pass != '\0') {
        pcVar15 = "%s FAILED\n";
      }
      ppfStack_5a0 = (fdb_kvs_handle **)0x118b2a;
      fprintf(_stderr,pcVar15,"last wal flush header test");
      return;
    }
  }
LAB_00118b41:
  ppfStack_5a0 = (fdb_kvs_handle **)0x118b46;
  last_wal_flush_header_test();
LAB_00118b46:
  ppfStack_5a0 = (fdb_kvs_handle **)0x118b4b;
  last_wal_flush_header_test();
LAB_00118b4b:
  ppfStack_5a0 = (fdb_kvs_handle **)0x118b50;
  last_wal_flush_header_test();
LAB_00118b50:
  ppfStack_5a0 = (fdb_kvs_handle **)0x118b55;
  last_wal_flush_header_test();
LAB_00118b55:
  ppfStack_5a0 = (fdb_kvs_handle **)long_key_test;
  last_wal_flush_header_test();
  pfStack_167e8 = (fdb_doc *)0x118b77;
  ppfStack_5c8 = &local_588;
  pfStack_5c0 = pfVar14;
  ppfStack_5b8 = ptr_fhandle;
  uStack_5b0 = uVar16;
  ppfStack_5a8 = ppfVar17;
  ppfStack_5a0 = ppfVar5;
  gettimeofday(&tStack_16780,(__timezone_ptr_t)0x0);
  pfStack_167e8 = (fdb_doc *)0x118b7c;
  memleak_start();
  pfStack_167d0 = (fdb_doc *)0x0;
  pfStack_167e8 = (fdb_doc *)0x118b91;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_167e8 = (fdb_doc *)0x118ba1;
  fdb_get_default_config();
  pfStack_167e8 = (fdb_doc *)0x118bae;
  fdb_get_default_kvs_config();
  fStack_16508.flags = 1;
  fStack_16508.purging_interval = 0;
  fStack_16508.compaction_threshold = '\0';
  fStack_16508.durability_opt = '\x02';
  pfStack_167e8 = (fdb_doc *)0x118bdb;
  fdb_open(&pfStack_167c8,"dummy1",&fStack_16508);
  pfStack_167e8 = (fdb_doc *)0x118beb;
  fdb_kvs_open_default(pfStack_167c8,&pfStack_167b8,&fStack_16770);
  ppfVar12 = apfStack_16310;
  __s = afStack_16710;
  pfVar13 = (fdb_doc *)0x0;
  lVar11 = 0;
  do {
    sVar6 = 0xff7f;
    if (lVar11 == 1) {
      sVar6 = 0x1fff;
    }
    if (lVar11 == 0) {
      sVar6 = 0x7fff;
    }
    pfStack_167e8 = (fdb_doc *)0x118c39;
    lStack_167b0 = lVar11;
    memset(asStack_10550,0x5f,sVar6);
    *(undefined1 *)((long)asStack_10550 + sVar6) = 0;
    lVar11 = 0;
    doc_00 = ppfVar12;
    lStack_167a8 = (long)pfVar13;
    ppfStack_167a0 = ppfVar12;
    sStack_16788 = sVar6;
    do {
      pfStack_167e8 = (fdb_doc *)0x118c6f;
      lStack_16798 = lVar11;
      sprintf((char *)__s,"%08d");
      asStack_10550[0] = afStack_16710[0].keylen;
      uVar16 = 0;
      lStack_167c0 = (long)pfVar13;
      ppfStack_16790 = doc_00;
      do {
        pfStack_167e8 = (fdb_doc *)0x118cab;
        sprintf((char *)__s,"%08d",uVar16 & 0xffffffff);
        *(size_t *)((long)apfStack_16310 + sStack_16788 + 0x5db8) = afStack_16710[0].keylen;
        uVar10 = (int)lStack_167c0 + (int)uVar16;
        pfStack_167e8 = (fdb_doc *)0x118ce4;
        sprintf(acStack_16410,"meta%d",(ulong)uVar10);
        pfStack_167e8 = (fdb_doc *)0x118cf7;
        sprintf(acStack_16610,"body%d",(ulong)uVar10);
        pfStack_167e8 = (fdb_doc *)0x118d04;
        sVar6 = strlen((char *)asStack_10550);
        pfStack_167e8 = (fdb_doc *)0x118d10;
        sVar7 = strlen(acStack_16410);
        pfStack_167e8 = (fdb_doc *)0x118d24;
        sVar8 = strlen(acStack_16610);
        lVar1 = lStack_167c0;
        pcVar15 = acStack_16610;
        pfStack_167e8 = (fdb_doc *)0x118d57;
        fdb_doc_create(doc_00,asStack_10550,sVar6 + 1,acStack_16410,sVar7 + 1,pcVar15,sVar8 + 1);
        uVar16 = uVar16 + 1;
        doc_00 = doc_00 + 1;
      } while (uVar16 != 10);
      lVar11 = lStack_16798 + 1;
      doc_00 = ppfStack_16790 + 10;
      pfVar13 = (fdb_doc *)(lVar1 + 10);
    } while (lVar11 != 100);
    lVar11 = lStack_167b0 + 1;
    ppfVar12 = ppfStack_167a0 + 1000;
    pfVar13 = (fdb_doc *)(lStack_167a8 + 1000);
  } while (lVar11 != 3);
  lVar11 = 0;
  do {
    pfStack_167e8 = (fdb_doc *)0x118dcd;
    fdb_set(pfStack_167b8,apfStack_16310[lVar11]);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3000);
  pfStack_167e8 = (fdb_doc *)0x118de8;
  fdb_commit(pfStack_167c8,'\x01');
  pfStack_167e8 = (fdb_doc *)0x118dfd;
  fdb_get_file_info(pfStack_167c8,&fStack_16758);
  if (fStack_16758.doc_count != 3000) {
    pfStack_167e8 = (fdb_doc *)0x118e14;
    long_key_test();
  }
  lVar11 = 0;
  while( true ) {
    pfStack_167e8 = (fdb_doc *)0x118e43;
    fdb_doc_create(&pfStack_167d0,apfStack_16310[lVar11]->key,apfStack_16310[lVar11]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_167e8 = (fdb_doc *)0x118e52;
    fVar3 = fdb_get(pfStack_167b8,pfStack_167d0);
    doc = pfStack_167d0;
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    doc_00 = (fdb_doc **)pfStack_167d0->key;
    __s = apfStack_16310[lVar11];
    pcVar15 = (char *)__s->key;
    pfStack_167e8 = (fdb_doc *)0x118e7d;
    iVar4 = bcmp(doc_00,pcVar15,pfStack_167d0->keylen);
    pfVar13 = doc;
    if (iVar4 != 0) {
      pfStack_167e8 = (fdb_doc *)0x118f61;
      long_key_test();
      break;
    }
    doc_00 = (fdb_doc **)doc->meta;
    pcVar15 = (char *)__s->meta;
    pfStack_167e8 = (fdb_doc *)0x118e9c;
    iVar4 = bcmp(doc_00,pcVar15,doc->metalen);
    if (iVar4 != 0) goto LAB_00118f71;
    doc_00 = (fdb_doc **)doc->body;
    pcVar15 = (char *)__s->body;
    pfStack_167e8 = (fdb_doc *)0x118ebb;
    iVar4 = bcmp(doc_00,pcVar15,doc->bodylen);
    if (iVar4 != 0) goto LAB_00118f66;
    pfStack_167e8 = (fdb_doc *)0x118ecb;
    fdb_doc_free(doc);
    pfStack_167d0 = (fdb_doc *)0x0;
    lVar11 = lVar11 + 1;
    if (lVar11 == 3000) {
      pfStack_167e8 = (fdb_doc *)0x118eee;
      fdb_close(pfStack_167c8);
      lVar11 = 0;
      do {
        pfStack_167e8 = (fdb_doc *)0x118efd;
        fdb_doc_free(apfStack_16310[lVar11]);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3000);
      pfStack_167e8 = (fdb_doc *)0x118f0e;
      fdb_shutdown();
      pfStack_167e8 = (fdb_doc *)0x118f13;
      memleak_end();
      pcVar15 = "%s PASSED\n";
      if (long_key_test()::__test_pass != '\0') {
        pcVar15 = "%s FAILED\n";
      }
      pfStack_167e8 = (fdb_doc *)0x118f44;
      fprintf(_stderr,pcVar15,"long key test");
      return;
    }
  }
  pfStack_167e8 = (fdb_doc *)0x118f66;
  long_key_test();
LAB_00118f66:
  pfStack_167e8 = (fdb_doc *)0x118f71;
  long_key_test();
LAB_00118f71:
  pfStack_167e8 = (fdb_doc *)open_multi_files_kvs_test;
  long_key_test();
  pfStack_1ace0 = (fdb_kvs_handle *)0x118f9c;
  ppfStack_16810 = &pfStack_167d0;
  pcStack_16808 = pcVar15;
  lStack_16800 = lVar11;
  pfStack_167f8 = pfVar13;
  ppfStack_167f0 = doc_00;
  pfStack_167e8 = __s;
  gettimeofday((timeval *)(auStack_1ac98 + 0x70),(__timezone_ptr_t)0x0);
  pfStack_1ace0 = (fdb_kvs_handle *)0x118fa1;
  memleak_start();
  pfStack_1ace0 = (fdb_kvs_handle *)0x118fad;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_1ace0 = (fdb_kvs_handle *)0x118fbd;
  fdb_get_default_config();
  pfStack_1ace0 = (fdb_kvs_handle *)0x118fc7;
  fdb_get_default_kvs_config();
  fStack_1ab10.wal_threshold = 0x400;
  fStack_1ab10.compaction_mode = '\0';
  fStack_1ab10.durability_opt = '\x02';
  handle = (char *)&fStack_1a818;
  ppfVar17 = apfStack_1aa18;
  pcVar15 = "kvs%d";
  uVar16 = 0;
  ppfVar5 = (fdb_kvs_handle **)0x0;
  do {
    pfStack_1ace0 = (fdb_kvs_handle *)0x119007;
    sprintf((char *)ppfVar17,"dummy%d",(ulong)ppfVar5 & 0xffffffff);
    ptr_handle = (char *)(apfStack_1ac18 + (long)ppfVar5 + -10);
    pfStack_1ace0 = (fdb_kvs_handle *)0x119022;
    fVar3 = fdb_open((fdb_file_handle **)ptr_handle,(char *)ppfVar17,&fStack_1ab10);
    pfVar9 = (fdb_kvs_handle *)handle;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119452;
    ppfVar2 = (fdb_kvs_handle **)0x0;
    ppfStack_1acc0 = ppfVar5;
    pfStack_1acb8 = (fdb_kvs_handle *)handle;
    do {
      ppfVar5 = ppfVar2;
      pfStack_1ace0 = (fdb_kvs_handle *)0x119048;
      sprintf((char *)ppfVar17,"kvs%d",(ulong)(uint)((int)ppfVar5 + (int)uVar16));
      pfStack_1ace0 = (fdb_kvs_handle *)0x11905b;
      fVar3 = fdb_kvs_open((fdb_file_handle *)*(fdb_kvs_handle **)ptr_handle,
                           (fdb_kvs_handle **)handle,(char *)ppfVar17,&fStack_1acb0);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_1ace0 = (fdb_kvs_handle *)0x11943e;
        open_multi_files_kvs_test();
        goto LAB_0011943e;
      }
      handle = (char *)&(((fdb_kvs_handle *)handle)->kvs_config).custom_cmp;
      ppfVar2 = (fdb_kvs_handle **)((long)ppfVar5 + 1);
    } while ((fdb_kvs_handle **)((long)ppfVar5 + 1) != (fdb_kvs_handle **)0x80);
    ppfVar5 = (fdb_kvs_handle **)((long)ppfStack_1acc0 + 1);
    uVar16 = uVar16 + 0x80;
    handle = (char *)&pfStack_1acb8[1].bub_ctx.space_used;
  } while (ppfVar5 != (fdb_kvs_handle **)0x8);
  ppfVar5 = apfStack_1ac18;
  ppfVar17 = apfStack_1a918;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    uVar16 = 0;
    do {
      pfStack_1ace0 = (fdb_kvs_handle *)0x1190bd;
      sprintf((char *)ppfVar5,"key%08d",uVar16);
      pfStack_1ace0 = (fdb_kvs_handle *)0x1190d0;
      sprintf((char *)ppfVar17,"value%08d",uVar16);
      pcVar15 = *(char **)(&fStack_1a818.kvs_config.create_if_missing + (long)pfVar9 * 8);
      pfStack_1ace0 = (fdb_kvs_handle *)0x1190e0;
      sVar6 = strlen((char *)ppfVar5);
      ptr_handle = (char *)(sVar6 + 1);
      pfStack_1ace0 = (fdb_kvs_handle *)0x1190ec;
      sVar6 = strlen((char *)ppfVar17);
      pfStack_1ace0 = (fdb_kvs_handle *)0x119101;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)pcVar15,ppfVar5,(size_t)ptr_handle,ppfVar17,sVar6 + 1);
      handle = (char *)pfVar9;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011943e;
      uVar10 = (int)uVar16 + 1;
      uVar16 = (ulong)uVar10;
    } while (uVar10 != 10);
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).field_0x1;
  } while (pfVar9 != (fdb_kvs_handle *)0x400);
  ptr_handle = (char *)0x0;
  do {
    if (((ulong)ptr_handle & 1) == 0) {
      pfStack_1ace0 = (fdb_kvs_handle *)0x11912f;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1ac18[(long)ptr_handle + -10],'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119470;
    }
    else {
      pfStack_1ace0 = (fdb_kvs_handle *)0x119142;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1ac18[(long)ptr_handle + -10],'\x01');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119475;
    }
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  ppfVar17 = (fdb_kvs_handle **)0xffffffffffffff80;
  ptr_handle = (char *)apfStack_18818;
  ppfVar5 = (fdb_kvs_handle **)(auStack_1ac98 + 8);
  pfVar9 = (fdb_kvs_handle *)auStack_1ac98;
  do {
    pfStack_1ace0 = (fdb_kvs_handle *)0x11917c;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1a418[(long)ppfVar17],(fdb_kvs_info *)pfVar9);
    if ((fdb_custom_cmp_variable)auStack_1ac98._8_8_ != (fdb_custom_cmp_variable)0xa) {
      pfStack_1ace0 = (fdb_kvs_handle *)0x1191bf;
      open_multi_files_kvs_test();
    }
    pfStack_1ace0 = (fdb_kvs_handle *)0x119199;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1a418[(long)ppfVar17],
                              (fdb_kvs_handle **)ptr_handle,auStack_1ac98._8_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119457;
    ppfVar17 = ppfVar17 + 0x10;
    ptr_handle = (char *)((long)ptr_handle + 0x400);
  } while (ppfVar17 < (fdb_kvs_handle **)0x380);
  ptr_handle = (char *)0x0;
  do {
    pfStack_1ace0 = (fdb_kvs_handle *)0x1191cf;
    fVar3 = fdb_compact((fdb_file_handle *)apfStack_1ac18[(long)ptr_handle - 10],(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011945c;
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  ptr_handle = (char *)&pfStack_1acc8;
  pfStack_1acc8 = (fdb_kvs_handle *)0x0;
  ppfVar5 = &pfStack_1acd0;
  handle = "key%08d";
  ppfVar17 = apfStack_1ac18;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1ace0 = (fdb_kvs_handle *)0x119224;
    fdb_iterator_init(apfStack_18818[(long)pfVar9],(fdb_iterator **)ppfVar5,(void *)0x0,0,
                      (void *)0x0,0,0);
    uVar16 = 0;
    do {
      pfStack_1ace0 = (fdb_kvs_handle *)0x119233;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_1acd0,(fdb_doc **)ptr_handle);
      pcVar15 = (char *)pfVar9;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119443;
      pfStack_1ace0 = (fdb_kvs_handle *)0x11924a;
      sprintf((char *)ppfVar17,"key%08d",uVar16);
      pfStack_1ace0 = (fdb_kvs_handle *)0x11925b;
      iVar4 = strcmp((char *)ppfVar17,(char *)pfStack_1acc8->op_stats);
      if (iVar4 != 0) {
        pfStack_1ace0 = (fdb_kvs_handle *)0x11927d;
        open_multi_files_kvs_test();
      }
      uVar16 = (ulong)((int)uVar16 + 1);
      pfStack_1ace0 = (fdb_kvs_handle *)0x11926b;
      fVar3 = fdb_iterator_next((fdb_iterator *)pfStack_1acd0);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1ace0 = (fdb_kvs_handle *)0x119289;
    fdb_iterator_close((fdb_iterator *)pfStack_1acd0);
    pcVar15 = (char *)&(pfVar9->config).wal_threshold;
    bVar18 = pfVar9 < (fdb_kvs_handle *)0x380;
    pfVar9 = (fdb_kvs_handle *)pcVar15;
  } while (bVar18);
  pfStack_1ace0 = (fdb_kvs_handle *)0x1192aa;
  fdb_doc_free((fdb_doc *)pfStack_1acc8);
  ptr_handle = "key%08d";
  ppfVar5 = apfStack_1ac18;
  ppfVar17 = (fdb_kvs_handle **)0x0;
  do {
    uVar16 = 0;
    do {
      pfStack_1ace0 = (fdb_kvs_handle *)0x1192cd;
      sprintf((char *)ppfVar5,"key%08d",uVar16);
      handle = *(char **)(&fStack_1a818.kvs_config.create_if_missing + (long)ppfVar17 * 8);
      pfStack_1ace0 = (fdb_kvs_handle *)0x1192dd;
      sVar6 = strlen((char *)ppfVar5);
      pfStack_1ace0 = (fdb_kvs_handle *)0x1192ec;
      fVar3 = fdb_del_kv((fdb_kvs_handle *)handle,ppfVar5,sVar6 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119448;
      uVar10 = (int)uVar16 + 1;
      uVar16 = (ulong)uVar10;
    } while (uVar10 != 10);
    ppfVar17 = (fdb_kvs_handle **)((long)ppfVar17 + 1);
  } while (ppfVar17 != (fdb_kvs_handle **)0x400);
  ptr_handle = "dummy_compact%d";
  ppfVar5 = apfStack_1aa18;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1ace0 = (fdb_kvs_handle *)0x119329;
    sprintf((char *)ppfVar5,"dummy_compact%d",(ulong)pfVar9 & 0xffffffff);
    pfStack_1ace0 = (fdb_kvs_handle *)0x119336;
    fVar3 = fdb_compact((fdb_file_handle *)
                        apfStack_1ac18[(long)((long)&pfVar9[-1].bub_ctx.space_used + 6)],
                        (char *)ppfVar5);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119461;
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).field_0x1;
  } while (pfVar9 != (fdb_kvs_handle *)0x8);
  ptr_handle = (char *)&pfStack_1acc8;
  pfStack_1acc8 = (fdb_kvs_handle *)0x0;
  ppfVar5 = &pfStack_1acd0;
  handle = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfStack_1ace0 = (fdb_kvs_handle *)0x11937c;
    fVar3 = fdb_iterator_init(*(fdb_kvs_handle **)
                               (&fStack_1a818.kvs_config.create_if_missing + (long)handle * 8),
                              (fdb_iterator **)ppfVar5,(void *)0x0,0,(void *)0x0,0,2);
    pfVar9 = (fdb_kvs_handle *)handle;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119466;
    do {
      pfStack_1ace0 = (fdb_kvs_handle *)0x119391;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_1acd0,(fdb_doc **)ptr_handle);
      if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0011944d;
      pfStack_1ace0 = (fdb_kvs_handle *)0x1193a3;
      fVar3 = fdb_iterator_next((fdb_iterator *)pfStack_1acd0);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1ace0 = (fdb_kvs_handle *)0x1193b2;
    fdb_iterator_close((fdb_iterator *)pfStack_1acd0);
    pfVar9 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)handle)->config).wal_threshold;
    bVar18 = handle < (fdb_kvs_handle *)0x380;
    handle = (char *)pfVar9;
  } while (bVar18);
  pfStack_1ace0 = (fdb_kvs_handle *)0x1193cf;
  fdb_doc_free((fdb_doc *)pfStack_1acc8);
  ptr_handle = (char *)0x0;
  while( true ) {
    pfStack_1ace0 = (fdb_kvs_handle *)0x1193db;
    fVar3 = fdb_close((fdb_file_handle *)apfStack_1ac18[(long)ptr_handle - 10]);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ptr_handle = (char *)((long)ptr_handle + 1);
    if ((fdb_kvs_handle **)ptr_handle == (fdb_kvs_handle **)0x8) {
      pfStack_1ace0 = (fdb_kvs_handle *)0x1193f1;
      fdb_shutdown();
      pfStack_1ace0 = (fdb_kvs_handle *)0x1193f6;
      memleak_end();
      pcVar15 = "%s PASSED\n";
      if (open_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar15 = "%s FAILED\n";
      }
      pfStack_1ace0 = (fdb_kvs_handle *)0x119427;
      fprintf(_stderr,pcVar15,"open multi files kvs test");
      return;
    }
  }
LAB_0011946b:
  pfStack_1ace0 = (fdb_kvs_handle *)0x119470;
  open_multi_files_kvs_test();
LAB_00119470:
  pfStack_1ace0 = (fdb_kvs_handle *)0x119475;
  open_multi_files_kvs_test();
LAB_00119475:
  pfStack_1ace0 = (fdb_kvs_handle *)get_byoffset_diff_kvs_test;
  open_multi_files_kvs_test();
  pcStack_1b058 = (code *)0x119494;
  ppfStack_1acf8 = (fdb_kvs_handle **)ptr_handle;
  ppfStack_1acf0 = ppfVar17;
  ppfStack_1ace8 = ppfVar5;
  pfStack_1ace0 = pfVar9;
  gettimeofday(&tStack_1b008,(__timezone_ptr_t)0x0);
  pcStack_1b058 = (code *)0x119499;
  memleak_start();
  pcStack_1b058 = (code *)0x1194a5;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar14 = &fStack_1aff8;
  pcStack_1b058 = (code *)0x1194b2;
  fdb_get_default_config();
  pcStack_1b058 = (code *)0x1194bc;
  fdb_get_default_kvs_config();
  pcStack_1b058 = (code *)0x1194d0;
  fVar3 = fdb_open(&pfStack_1b038,"./dummy1",pfVar14);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcStack_1b058 = (code *)0x1194f3;
    fVar3 = fdb_kvs_open(pfStack_1b038,&pfStack_1b030,"db",&fStack_1b020);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196a6;
    pcStack_1b058 = (code *)0x119516;
    fVar3 = fdb_kvs_open(pfStack_1b038,&pfStack_1b028,"db2",&fStack_1b020);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ab;
    pfVar14 = &fStack_1ae00;
    pcStack_1b058 = (code *)0x119539;
    sprintf((char *)pfVar14,"key%d",0);
    ppfVar5 = apfStack_1af00;
    pcStack_1b058 = (code *)0x119554;
    sprintf((char *)ppfVar5,"body%d",0);
    pcStack_1b058 = (code *)0x11955c;
    pfVar9 = (fdb_kvs_handle *)strlen((char *)pfVar14);
    pcStack_1b058 = (code *)0x119567;
    sVar6 = strlen((char *)ppfVar5);
    ppfVar17 = &pfStack_1b040;
    pcStack_1b058 = (code *)0x119589;
    fdb_doc_create((fdb_doc **)ppfVar17,pfVar14,(size_t)pfVar9,(void *)0x0,0,ppfVar5,sVar6 + 1);
    pcStack_1b058 = (code *)0x119597;
    fVar3 = fdb_set(pfStack_1b030,(fdb_doc *)pfStack_1b040);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b0;
    pcStack_1b058 = (code *)0x1195ae;
    fVar3 = fdb_commit(pfStack_1b038,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b5;
    pcStack_1b058 = (code *)0x1195cf;
    sprintf((char *)(pfStack_1b040->field_6).seqtree,"bOdy%d",0);
    pcStack_1b058 = (code *)0x1195de;
    fVar3 = fdb_set(pfStack_1b028,(fdb_doc *)pfStack_1b040);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ba;
    pcStack_1b058 = (code *)0x1195f5;
    fVar3 = fdb_commit(pfStack_1b038,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196bf;
    pcStack_1b058 = (code *)0x11960c;
    fVar3 = fdb_get_metaonly(pfStack_1b030,(fdb_doc *)pfStack_1b040);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c4;
    pcStack_1b058 = (code *)0x119623;
    fVar3 = fdb_get_metaonly(pfStack_1b028,(fdb_doc *)pfStack_1b040);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c9;
    pcStack_1b058 = (code *)0x11963a;
    fVar3 = fdb_get_byoffset(pfStack_1b030,(fdb_doc *)pfStack_1b040);
    if (fVar3 == FDB_RESULT_KEY_NOT_FOUND) {
      pcStack_1b058 = (code *)0x11964d;
      fdb_close(pfStack_1b038);
      pcStack_1b058 = (code *)0x119657;
      fdb_doc_free((fdb_doc *)pfStack_1b040);
      pcStack_1b058 = (code *)0x11965c;
      fdb_shutdown();
      pcStack_1b058 = (code *)0x119661;
      memleak_end();
      pcVar15 = "%s PASSED\n";
      if (get_byoffset_diff_kvs_test()::__test_pass != '\0') {
        pcVar15 = "%s FAILED\n";
      }
      pcStack_1b058 = (code *)0x119692;
      fprintf(_stderr,pcVar15,"get byoffset diff kvs");
      return;
    }
  }
  else {
    pcStack_1b058 = (code *)0x1196a6;
    get_byoffset_diff_kvs_test();
LAB_001196a6:
    pcStack_1b058 = (code *)0x1196ab;
    get_byoffset_diff_kvs_test();
LAB_001196ab:
    pcStack_1b058 = (code *)0x1196b0;
    get_byoffset_diff_kvs_test();
LAB_001196b0:
    pcStack_1b058 = (code *)0x1196b5;
    get_byoffset_diff_kvs_test();
LAB_001196b5:
    pcStack_1b058 = (code *)0x1196ba;
    get_byoffset_diff_kvs_test();
LAB_001196ba:
    pcStack_1b058 = (code *)0x1196bf;
    get_byoffset_diff_kvs_test();
LAB_001196bf:
    pcStack_1b058 = (code *)0x1196c4;
    get_byoffset_diff_kvs_test();
LAB_001196c4:
    pcStack_1b058 = (code *)0x1196c9;
    get_byoffset_diff_kvs_test();
LAB_001196c9:
    pcStack_1b058 = (code *)0x1196ce;
    get_byoffset_diff_kvs_test();
  }
  pcStack_1b058 = rekey_test;
  get_byoffset_diff_kvs_test();
  pfStack_1b080 = pfVar14;
  ppfStack_1b078 = ppfVar17;
  pfStack_1b070 = (fdb_kvs_handle *)pcVar15;
  ppfStack_1b068 = ppfVar5;
  pfStack_1b060 = pfVar9;
  pcStack_1b058 = (code *)uVar16;
  gettimeofday(&tStack_1b490,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_1b480.wal_threshold = 0x400;
  fStack_1b480.flags = 1;
  fStack_1b480.purging_interval = 0;
  fStack_1b480.compaction_threshold = '\0';
  fStack_1b480.encryption_key.algorithm = -1;
  builtin_memcpy(fStack_1b480.encryption_key.bytes,"BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB",0x20);
  fdb_open(&pfStack_1b4e8,"./dummy1",&fStack_1b480);
  fdb_kvs_open_default(pfStack_1b4e8,&pfStack_1b4f0,&fStack_1b4a8);
  fVar3 = fdb_set_log_callback(pfStack_1b4f0,logCallbackFunc,"api_wrapper_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fVar3 = fdb_set_kv(pfStack_1b4f0,(void *)0x0,0,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_00119a28;
    uVar16 = 0;
    do {
      sprintf(acStack_1b288,"key%d",uVar16);
      sprintf(acStack_1b188,"body%d",uVar16);
      pfVar9 = pfStack_1b4f0;
      sVar6 = strlen(acStack_1b288);
      sVar7 = strlen(acStack_1b188);
      fVar3 = fdb_set_kv(pfVar9,acStack_1b288,sVar6,acStack_1b188,sVar7);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        rekey_test();
        goto LAB_00119a0a;
      }
      uVar10 = (int)uVar16 + 1;
      uVar16 = (ulong)uVar10;
    } while (uVar10 != 10);
    asStack_1b4d8[1] = 0x726162ffffffff;
    asStack_1b4d8[2] = 0xbdbdbdbdbdbdbdbd;
    uStack_1b4c0 = 0xbdbdbdbd;
    uStack_1b4bc = 0xbdbdbdbd;
    uStack_1b4b8 = 0xbdbdbdbd;
    uStack_1b4b4 = 0xbdbdbdbd;
    uStack_1b4b0 = 0xbdbdbdbd;
    new_key.bytes[4] = 0xbd;
    new_key.bytes[5] = 0xbd;
    new_key.bytes[6] = 0xbd;
    new_key.bytes[7] = 0xbd;
    new_key.bytes[8] = 0xbd;
    new_key.bytes[9] = 0xbd;
    new_key.bytes[10] = 0xbd;
    new_key.bytes[0xb] = 0xbd;
    new_key.algorithm = -1;
    new_key.bytes[0] = 'b';
    new_key.bytes[1] = 'a';
    new_key.bytes[2] = 'r';
    new_key.bytes[3] = '\0';
    new_key.bytes[0xc] = 0xbd;
    new_key.bytes[0xd] = 0xbd;
    new_key.bytes[0xe] = 0xbd;
    new_key.bytes[0xf] = 0xbd;
    new_key.bytes[0x10] = 0xbd;
    new_key.bytes[0x11] = 0xbd;
    new_key.bytes[0x12] = 0xbd;
    new_key.bytes[0x13] = 0xbd;
    new_key.bytes[0x14] = 0xbd;
    new_key.bytes[0x15] = 0xbd;
    new_key.bytes[0x16] = 0xbd;
    new_key.bytes[0x17] = 0xbd;
    new_key.bytes[0x18] = 0xbd;
    new_key.bytes[0x19] = 0xbd;
    new_key.bytes[0x1a] = 0xbd;
    new_key.bytes[0x1b] = 0xbd;
    new_key.bytes[0x1c] = 0xbd;
    new_key.bytes[0x1d] = 0xbd;
    new_key.bytes[0x1e] = 0xbd;
    new_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_rekey(pfStack_1b4e8,new_key);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a2d;
    fdb_kvs_close(pfStack_1b4f0);
    fdb_close(pfStack_1b4e8);
    fStack_1b480.encryption_key.algorithm = -1;
    builtin_memcpy(fStack_1b480.encryption_key.bytes,"bar",4);
    fStack_1b480.encryption_key.bytes[4] = 0xbd;
    fStack_1b480.encryption_key.bytes[5] = 0xbd;
    fStack_1b480.encryption_key.bytes[6] = 0xbd;
    fStack_1b480.encryption_key.bytes[7] = 0xbd;
    fStack_1b480.encryption_key.bytes[8] = 0xbd;
    fStack_1b480.encryption_key.bytes[9] = 0xbd;
    fStack_1b480.encryption_key.bytes[10] = 0xbd;
    fStack_1b480.encryption_key.bytes[0xb] = 0xbd;
    fStack_1b480.encryption_key.bytes[0xc] = 0xbd;
    fStack_1b480.encryption_key.bytes[0xd] = 0xbd;
    fStack_1b480.encryption_key.bytes[0xe] = 0xbd;
    fStack_1b480.encryption_key.bytes[0xf] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x10] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x11] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x12] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x13] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x14] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x15] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x16] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x17] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x18] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x19] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x1a] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x1b] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x1c] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x1d] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x1e] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_open(&pfStack_1b4e8,"./dummy1",&fStack_1b480);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a34;
    fVar3 = fdb_kvs_open_default(pfStack_1b4e8,&pfStack_1b4f0,&fStack_1b4a8);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_set_log_callback(pfStack_1b4f0,logCallbackFunc,"api_wrapper_test");
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a42;
      uVar16 = 0;
      while( true ) {
        sprintf(acStack_1b288,"key%d",uVar16);
        pfVar9 = pfStack_1b4f0;
        sVar6 = strlen(acStack_1b288);
        fVar3 = fdb_get_kv(pfVar9,acStack_1b288,sVar6,&pvStack_1b4e0,asStack_1b4d8);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        sprintf(acStack_1b388,"body%d",uVar16);
        ptr = pvStack_1b4e0;
        iVar4 = bcmp(pvStack_1b4e0,acStack_1b388,asStack_1b4d8[0]);
        if (iVar4 != 0) goto LAB_00119a0a;
        fdb_free_block(ptr);
        uVar10 = (int)uVar16 + 1;
        uVar16 = (ulong)uVar10;
        if (uVar10 == 10) {
          fdb_kvs_close(pfStack_1b4f0);
          fdb_close(pfStack_1b4e8);
          fdb_shutdown();
          memleak_end();
          pcVar15 = "%s PASSED\n";
          if (rekey_test()::__test_pass != '\0') {
            pcVar15 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar15,"encryption rekey test");
          return;
        }
      }
LAB_00119a1a:
      rekey_test();
      goto LAB_00119a21;
    }
  }
  else {
LAB_00119a21:
    rekey_test();
LAB_00119a28:
    rekey_test();
LAB_00119a2d:
    rekey_test();
LAB_00119a34:
    rekey_test();
  }
  rekey_test();
LAB_00119a42:
  rekey_test();
  return;
LAB_0011943e:
  pfStack_1ace0 = (fdb_kvs_handle *)0x119443;
  open_multi_files_kvs_test();
LAB_00119443:
  pfStack_1ace0 = (fdb_kvs_handle *)0x119448;
  open_multi_files_kvs_test();
LAB_00119448:
  pfStack_1ace0 = (fdb_kvs_handle *)0x11944d;
  open_multi_files_kvs_test();
LAB_0011944d:
  pfStack_1ace0 = (fdb_kvs_handle *)0x119452;
  open_multi_files_kvs_test();
  pfVar9 = (fdb_kvs_handle *)handle;
LAB_00119452:
  pfStack_1ace0 = (fdb_kvs_handle *)0x119457;
  open_multi_files_kvs_test();
LAB_00119457:
  pfStack_1ace0 = (fdb_kvs_handle *)0x11945c;
  open_multi_files_kvs_test();
LAB_0011945c:
  pfStack_1ace0 = (fdb_kvs_handle *)0x119461;
  open_multi_files_kvs_test();
LAB_00119461:
  pfStack_1ace0 = (fdb_kvs_handle *)0x119466;
  open_multi_files_kvs_test();
LAB_00119466:
  pfStack_1ace0 = (fdb_kvs_handle *)0x11946b;
  open_multi_files_kvs_test();
  goto LAB_0011946b;
LAB_00119a0a:
  rekey_test();
  goto LAB_00119a1a;
}

Assistant:

void last_wal_flush_header_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 30;
    fdb_file_handle *dbfile, *dbfile_txn1, *dbfile_txn2;
    fdb_kvs_handle *db, *db_txn1, *db_txn2;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "dummy1", &fconfig);
    fdb_open(&dbfile_txn1, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);

    // create docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
    }

    // insert docs without transaction
    for (i=0;i<2;++i) {
        fdb_set(db, doc[i]);
    }
    // insert docs using transaction
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    for (i=2;i<4;++i){
        fdb_set(db_txn1, doc[i]);
    }
    // commit without transaction
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // close & reopen db
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);
    fdb_open(&dbfile, "dummy1", &fconfig);
    fdb_open(&dbfile_txn1, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);

    // retrieve check
    for (i=0;i<4;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        if (i<2) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            TEST_CHK(status != FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // insert docs using transaction
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    for (i=2;i<4;++i){
        fdb_set(db_txn1, doc[i]);
    }
    // insert docs without transaction
    for (i=4;i<6;++i){
        fdb_set(db, doc[i]);
    }
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // close & reopen db
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);
    fdb_open(&dbfile, "dummy1", &fconfig);
    fdb_open(&dbfile_txn1, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);

    // retrieve check
    for (i=0;i<6;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        if (i<4) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            // doesn't matter
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // insert docs without transaction
    for (i=4;i<6;++i) {
        fdb_set(db, doc[i]);
    }
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    for (i=6;i<8;++i) {
        fdb_set(db_txn1, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // begin another transaction
    fdb_open(&dbfile_txn2, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile_txn2, &db_txn2, &kvs_config);
    fdb_begin_transaction(dbfile_txn2, FDB_ISOLATION_READ_COMMITTED);
    for (i=8;i<10;++i){
        fdb_set(db_txn2, doc[i]);
    }
    fdb_end_transaction(dbfile_txn2, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // close & reopen db
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);
    fdb_close(dbfile_txn2);
    fdb_open(&dbfile, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // retrieve check
    for (i=0;i<10;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        if (i<6 || i>=8) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            TEST_CHK(status != FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    fdb_open(&dbfile_txn1, "dummy1", &fconfig);
    fdb_open(&dbfile_txn2, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);
    fdb_kvs_open_default(dbfile_txn2, &db_txn2, &kvs_config);
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);

    fdb_set(db, doc[10]);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    fdb_set(db, doc[11]);
    fdb_set(db_txn1, doc[12]);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    fdb_set(db_txn1, doc[13]);
    fdb_begin_transaction(dbfile_txn2, FDB_ISOLATION_READ_COMMITTED);
    fdb_set(db_txn2, doc[14]);
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_MANUAL_WAL_FLUSH);

    fdb_set(db_txn2, doc[15]);
    fdb_set(db, doc[16]);
    fdb_end_transaction(dbfile_txn2, FDB_COMMIT_MANUAL_WAL_FLUSH);

    fdb_set(db, doc[17]);
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    fdb_close(dbfile);
    fdb_close(dbfile_txn1);
    fdb_close(dbfile_txn2);
    fdb_open(&dbfile, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // retrieve check
    for (i=10;i<18;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    fdb_open(&dbfile_txn1, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    fdb_set(db_txn1, doc[20]);

    fdb_compact(dbfile, "dummy2");

    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_MANUAL_WAL_FLUSH);
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("last wal flush header test");
}